

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O0

int __thiscall QBuffer::open(QBuffer *this,char *__file,int __oflag,...)

{
  bool bVar1;
  QFlags<QIODeviceBase::OpenModeFlag> QVar2;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> QVar3;
  int iVar4;
  int __oflag_00;
  long in_FS_OFFSET;
  QBufferPrivate *d;
  undefined4 in_stack_ffffffffffffff68;
  OpenModeFlag in_stack_ffffffffffffff6c;
  OpenModeFlag in_stack_ffffffffffffff70;
  enum_type in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  byte local_31;
  QMessageLogger local_30;
  CompareAgainstLiteralZero local_e;
  CompareAgainstLiteralZero local_d;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.i = (Int)__file;
  d_func((QBuffer *)0x273e27);
  ::operator|(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
  QVar2 = QFlags<QIODeviceBase::OpenModeFlag>::operator&
                    ((QFlags<QIODeviceBase::OpenModeFlag> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)SUB84(this,0));
  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_d,0);
  bVar1 = ::operator!=(QVar2.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                       super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
  if (bVar1) {
    QFlags<QIODeviceBase::OpenModeFlag>::operator|=
              ((QFlags<QIODeviceBase::OpenModeFlag> *)&local_c,WriteOnly);
  }
  ::operator|(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
  QVar2 = QFlags<QIODeviceBase::OpenModeFlag>::operator&
                    ((QFlags<QIODeviceBase::OpenModeFlag> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)SUB84(this,0));
  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_e,0);
  bVar1 = ::operator==(QVar2.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                       super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (char *)this,in_stack_ffffffffffffff74,
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QMessageLogger::warning(&local_30,"QBuffer::open: Buffer access not specified");
    local_31 = 0;
  }
  else {
    QVar3.i = (Int)QFlags<QIODeviceBase::OpenModeFlag>::operator&
                             ((QFlags<QIODeviceBase::OpenModeFlag> *)
                              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              in_stack_ffffffffffffff6c);
    bVar1 = ::operator==((QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)
                         SUB84((ulong)this >> 0x20,0),in_stack_ffffffffffffff70);
    if (bVar1) {
      QByteArray::resize((QByteArray *)CONCAT44(QVar3.i,in_stack_ffffffffffffff80),(qsizetype)this);
    }
    QVar2 = QFlags<QIODeviceBase::OpenModeFlag>::operator|
                      ((QFlags<QIODeviceBase::OpenModeFlag> *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff6c);
    iVar4 = QIODevice::open(&this->super_QIODevice,
                            (char *)(ulong)(uint)QVar2.
                                                 super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>
                                                 .super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i
                            ,__oflag_00);
    local_31 = (byte)iVar4 & 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_31);
}

Assistant:

bool QBuffer::open(OpenMode mode)
{
    Q_D(QBuffer);

    if ((mode & (Append | Truncate)) != 0)
        mode |= WriteOnly;
    if ((mode & (ReadOnly | WriteOnly)) == 0) {
        qWarning("QBuffer::open: Buffer access not specified");
        return false;
    }

    if ((mode & Truncate) == Truncate)
        d->buf->resize(0);

    return QIODevice::open(mode | QIODevice::Unbuffered);
}